

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  cTValue *pcVar1;
  ulong uVar2;
  GCstr *pGVar3;
  int in_EDX;
  cTValue *in_RSI;
  long in_RDI;
  MSize len;
  GCstr *s;
  SBuf *sb;
  uint64_t tlen;
  TValue *o;
  TValue *e;
  cTValue *mo;
  int fromc;
  SBuf *sb_1;
  long in_stack_fffffffffffffe58;
  ErrMsg EVar4;
  cTValue *in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6a;
  undefined1 uVar5;
  uint uVar6;
  uint uVar7;
  ulong in_stack_fffffffffffffe78;
  MMS mm;
  cTValue *in_stack_fffffffffffffe80;
  lua_State *in_stack_fffffffffffffe88;
  cTValue *in_stack_fffffffffffffe90;
  cTValue *in_stack_fffffffffffffe98;
  int local_154;
  cTValue *local_150;
  size_t in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  lua_State *in_stack_fffffffffffffed0;
  
  local_154 = in_EDX;
  local_150 = in_RSI;
  if (in_EDX < 0) {
    local_154 = -in_EDX;
  }
  while( true ) {
    EVar4 = (ErrMsg)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    mm = (MMS)(in_stack_fffffffffffffe78 >> 0x20);
    if ((((local_150->field_2).it != 0xfffffffb) && (0xfffeffff < (local_150->field_2).it)) ||
       ((*(int *)((long)local_150 + -4) != -5 && (0xfffeffff < *(uint *)((long)local_150 + -4))))) {
      pcVar1 = lj_meta_lookup(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,mm);
      if (((pcVar1->field_2).it == 0xffffffff) &&
         (pcVar1 = lj_meta_lookup(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,mm),
         (pcVar1->field_2).it == 0xffffffff)) {
        lj_err_optype((lua_State *)&pcVar1->field_2,in_stack_fffffffffffffe98,EVar4);
      }
      local_150[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)local_150;
      local_150[1] = local_150[-1];
      *local_150 = *pcVar1;
      local_150[-1].n = 3.83345534608223e-320;
      return local_150 + 1;
    }
    if ((local_150->field_2).it == 0xfffffffb) {
      uVar7 = *(uint *)((ulong)(local_150->u32).lo + 0xc);
    }
    else {
      uVar7 = 0x20;
    }
    in_stack_fffffffffffffe88 = (lua_State *)(ulong)uVar7;
    pcVar1 = local_150;
    do {
      in_stack_fffffffffffffe90 = pcVar1 + -1;
      if (*(int *)((long)pcVar1 + -4) == -5) {
        uVar6 = *(uint *)((ulong)(in_stack_fffffffffffffe90->u32).lo + 0xc);
      }
      else {
        uVar6 = 0x20;
      }
      in_stack_fffffffffffffe88 =
           (lua_State *)((long)&(in_stack_fffffffffffffe88->nextgc).gcptr32 + (ulong)uVar6);
      local_154 = local_154 + -1;
      uVar5 = false;
      if ((0 < local_154) &&
         (in_stack_fffffffffffffe6a = true, uVar5 = in_stack_fffffffffffffe6a,
         *(int *)((long)pcVar1 + -0xc) != -5)) {
        in_stack_fffffffffffffe6a = *(uint *)((long)pcVar1 + -0xc) < 0xffff0000;
        uVar5 = in_stack_fffffffffffffe6a;
      }
      pcVar1 = in_stack_fffffffffffffe90;
    } while ((bool)uVar5 != false);
    EVar4 = (ErrMsg)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if ((lua_State *)0x7ffffeff < in_stack_fffffffffffffe88) break;
    uVar2 = (ulong)*(uint *)(in_RDI + 8);
    in_stack_fffffffffffffe80 = (cTValue *)(uVar2 + 0xe8);
    *(int *)(uVar2 + 0xf4) = (int)in_RDI;
    (in_stack_fffffffffffffe80->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)(uVar2 + 0xf0);
    if (*(int *)(uVar2 + 0xec) - (in_stack_fffffffffffffe80->u32).lo <
        (uint)in_stack_fffffffffffffe88) {
      lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->field_2,EVar4);
      pcVar1 = in_stack_fffffffffffffe90;
    }
    for (; in_stack_fffffffffffffe90 <= local_150;
        in_stack_fffffffffffffe90 = in_stack_fffffffffffffe90 + 1) {
      if ((in_stack_fffffffffffffe90->field_2).it == 0xfffffffb) {
        in_stack_fffffffffffffe78 = (ulong)(in_stack_fffffffffffffe90->u32).lo;
        lj_buf_putmem((SBuf *)CONCAT44(*(undefined4 *)(in_stack_fffffffffffffe78 + 0xc),uVar7),
                      (void *)CONCAT44(uVar6,CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffe6a,
                                                                     in_stack_fffffffffffffe68))),
                      (MSize)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      }
      else {
        lj_strfmt_putfnum((SBuf *)&in_stack_fffffffffffffe60->field_2,
                          (SFormat)((ulong)in_stack_fffffffffffffe58 >> 0x20),5.74795972371706e-318)
        ;
      }
    }
    in_stack_fffffffffffffe58 = in_RDI;
    in_stack_fffffffffffffe60 = pcVar1;
    pGVar3 = lj_str_new(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffec0);
    (in_stack_fffffffffffffe60->u32).lo = (uint32_t)pGVar3;
    (in_stack_fffffffffffffe60->field_2).it = 0xfffffffb;
    in_stack_fffffffffffffe98 = local_150;
    local_150 = pcVar1;
    if (local_154 < 1) {
      if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
          *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
        if (in_EDX >= 0) {
          *(long *)(in_RDI + 0x18) =
               *(long *)(in_RDI + 0x10) +
               (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10)
                                                                           + -8) + 0x10) - 0x39) * 8
          ;
        }
        lj_gc_step((lua_State *)
                   CONCAT44(uVar6,CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffe6a,
                                                          in_stack_fffffffffffffe68))));
      }
      return (TValue *)0x0;
    }
  }
  lj_err_msg((lua_State *)&in_stack_fffffffffffffe60->field_2,EVar4);
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    if (!(tvisstr(top) || tvisnumber(top)) ||
	!(tvisstr(top-1) || tvisnumber(top-1))) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2*LJ_FR2+2, top);  /* Carefully ordered stack copies! */
      copyTV(L, top+2*LJ_FR2+1, top-1);
      copyTV(L, top+LJ_FR2, mo);
      setcont(top-1, lj_cont_cat);
      if (LJ_FR2) { setnilV(top); setnilV(top+2); top += 2; }
      return top+1;  /* Trigger metamethod call. */
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      TValue *e, *o = top;
      uint64_t tlen = tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      SBuf *sb;
      do {
	o--; tlen += tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      } while (--left > 0 && (tvisstr(o-1) || tvisnumber(o-1)));
      if (tlen >= LJ_MAX_STR) lj_err_msg(L, LJ_ERR_STROV);
      sb = lj_buf_tmp_(L);
      lj_buf_more(sb, (MSize)tlen);
      for (e = top, top = o; o <= e; o++) {
	if (tvisstr(o)) {
	  GCstr *s = strV(o);
	  MSize len = s->len;
	  lj_buf_putmem(sb, strdata(s), len);
	} else if (tvisint(o)) {
	  lj_strfmt_putint(sb, intV(o));
	} else {
	  lj_strfmt_putfnum(sb, STRFMT_G14, numV(o));
	}
      }
      setstrV(L, top, lj_buf_str(L, sb));
    }
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}